

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionShape.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChBeamSectionShapeRectangular::UpdateProfile(ChBeamSectionShapeRectangular *this)

{
  undefined8 uVar1;
  pointer pvVar2;
  undefined8 *puVar3;
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 local_38;
  undefined8 uStack_30;
  
  std::
  vector<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>_>
  ::resize(&this->ml_points,4);
  std::
  vector<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>_>
  ::resize(&this->ml_normals,4);
  dVar5 = this->y_thick * 0.5;
  dVar6 = this->z_thick * 0.5;
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::resize
            ((this->ml_points).
             super__Vector_base<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,2);
  pvVar2 = (this->ml_points).
           super__Vector_base<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = *(undefined8 **)
            &(pvVar2->
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             )._M_impl.super__Vector_impl_data;
  auVar7._0_8_ = -dVar5;
  auVar7._8_4_ = 0;
  auVar7._12_4_ = 0x80000000;
  auVar8._0_8_ = -dVar6;
  auVar8._8_4_ = 0;
  auVar8._12_4_ = 0x80000000;
  *puVar3 = 0;
  auVar4 = vmovlhps_avx(auVar7,auVar8);
  *(undefined1 (*) [16])(puVar3 + 1) = auVar4;
  puVar3[3] = 0;
  puVar3[4] = dVar5;
  uVar1 = vmovlps_avx(auVar8);
  puVar3[5] = uVar1;
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::resize
            (pvVar2 + 1,2);
  pvVar2 = (this->ml_points).
           super__Vector_base<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = *(undefined8 **)
            &pvVar2[1].
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data;
  *puVar3 = 0;
  puVar3[1] = dVar5;
  uVar1 = vmovlps_avx(auVar8);
  puVar3[2] = uVar1;
  puVar3[3] = 0;
  puVar3[4] = dVar5;
  puVar3[5] = dVar6;
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::resize
            (pvVar2 + 2,2);
  pvVar2 = (this->ml_points).
           super__Vector_base<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = *(undefined8 **)
            &pvVar2[2].
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data;
  *puVar3 = 0;
  puVar3[1] = dVar5;
  puVar3[2] = dVar6;
  puVar3[3] = 0;
  uVar1 = vmovlps_avx(auVar7);
  puVar3[4] = uVar1;
  puVar3[5] = dVar6;
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::resize
            (pvVar2 + 3,2);
  puVar3 = *(undefined8 **)
            &(this->ml_points).
             super__Vector_base<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[3].
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data;
  *puVar3 = 0;
  uVar1 = vmovlps_avx(auVar7);
  puVar3[1] = uVar1;
  puVar3[2] = dVar6;
  puVar3[3] = 0;
  local_38 = auVar4._0_8_;
  uStack_30 = auVar4._8_8_;
  puVar3[4] = local_38;
  puVar3[5] = uStack_30;
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::resize
            ((this->ml_normals).
             super__Vector_base<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,2);
  pvVar2 = (this->ml_normals).
           super__Vector_base<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = *(undefined8 **)
            &(pvVar2->
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             )._M_impl.super__Vector_impl_data;
  *puVar3 = 0;
  puVar3[1] = 0;
  puVar3[2] = 0xbff0000000000000;
  puVar3[3] = 0;
  puVar3[4] = 0;
  puVar3[5] = 0xbff0000000000000;
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::resize
            (pvVar2 + 1,2);
  pvVar2 = (this->ml_normals).
           super__Vector_base<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = *(undefined8 **)
            &pvVar2[1].
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data;
  *puVar3 = 0;
  puVar3[1] = 0x3ff0000000000000;
  puVar3[2] = 0;
  puVar3[3] = 0;
  puVar3[4] = 0x3ff0000000000000;
  puVar3[5] = 0;
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::resize
            (pvVar2 + 2,2);
  pvVar2 = (this->ml_normals).
           super__Vector_base<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = *(undefined8 **)
            &pvVar2[2].
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data;
  *puVar3 = 0;
  puVar3[1] = 0;
  puVar3[2] = 0x3ff0000000000000;
  puVar3[3] = 0;
  puVar3[4] = 0;
  puVar3[5] = 0x3ff0000000000000;
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::resize
            (pvVar2 + 3,2);
  puVar3 = *(undefined8 **)
            &(this->ml_normals).
             super__Vector_base<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[3].
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data;
  *puVar3 = 0;
  puVar3[1] = 0xbff0000000000000;
  puVar3[2] = 0;
  puVar3[3] = 0;
  puVar3[4] = 0xbff0000000000000;
  puVar3[5] = 0;
  return;
}

Assistant:

void ChBeamSectionShapeRectangular::UpdateProfile() {
    ml_points.resize(4);
    ml_normals.resize(4);

    double y_thick_half = 0.5 * y_thick;
    double z_thick_half = 0.5 * z_thick;

    ml_points[0].resize(2);
    ml_points[0][0].Set(0, -y_thick_half, -z_thick_half);
    ml_points[0][1].Set(0, y_thick_half, -z_thick_half);

    ml_points[1].resize(2);
    ml_points[1][0].Set(0, y_thick_half, -z_thick_half);
    ml_points[1][1].Set(0, y_thick_half, z_thick_half);

    ml_points[2].resize(2);
    ml_points[2][0].Set(0, y_thick_half, z_thick_half);
    ml_points[2][1].Set(0, -y_thick_half, z_thick_half);

    ml_points[3].resize(2);
    ml_points[3][0].Set(0, -y_thick_half, z_thick_half);
    ml_points[3][1].Set(0, -y_thick_half, -z_thick_half);

    ml_normals[0].resize(2);
    ml_normals[0][0].Set(0, 0, -1);
    ml_normals[0][1].Set(0, 0, -1);

    ml_normals[1].resize(2);
    ml_normals[1][0].Set(0, 1, 0);
    ml_normals[1][1].Set(0, 1, 0);

    ml_normals[2].resize(2);
    ml_normals[2][0].Set(0, 0, 1);
    ml_normals[2][1].Set(0, 0, 1);

    ml_normals[3].resize(2);
    ml_normals[3][0].Set(0, -1, 0);
    ml_normals[3][1].Set(0, -1, 0);
}